

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

ssize_t __thiscall blc::tools::VFile::write(VFile *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *in_stack_00000138;
  exception *in_stack_00000140;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  if ((this->_isClosed & 1U) != 0) {
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar4,in_stack_ffffffffffffff90)));
    error::exception::exception(in_stack_00000140,in_stack_00000138);
    __cxa_throw(uVar3,&error::exception::typeinfo,error::exception::~exception);
  }
  iVar1 = this->_cursor;
  uVar2 = std::__cxx11::string::size();
  if ((ulong)(long)iVar1 <= uVar2) {
    std::__cxx11::string::insert((ulong)&this->_cache,(string *)(long)this->_cursor);
    iVar1 = std::__cxx11::string::size();
    this->_cursor = this->_cursor + iVar1;
    return (ssize_t)this;
  }
  uVar3 = __cxa_allocate_exception(0x78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  error::exception::exception(in_stack_00000140,in_stack_00000138);
  __cxa_throw(uVar3,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::tools::VFile::write(const std::string &str) const {
	if (!this->_isClosed) {
		if (this->_cursor <= this->_cache.size()) {
			( const_cast <VFile*> (this) )->_cache.insert(this->_cursor, str);
			( const_cast <VFile*> (this) )->_cursor += str.size();
		} else {
			throw blc::error::exception("Cursor exeeds the size of file");
		}
	} else {
		throw blc::error::exception("Attempt to write on a closed virtual file");
	}
}